

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3DequoteToken(Token *p)

{
  byte *pbVar1;
  uint uVar2;
  byte *pbVar3;
  ulong uVar4;
  
  uVar2 = p->n;
  if ((1 < uVar2) && (pbVar3 = (byte *)p->z, (char)""[*pbVar3] < '\0')) {
    uVar4 = 1;
    do {
      if (uVar2 - 1 == uVar4) {
        p->n = uVar2 - 2;
        p->z = (char *)(pbVar3 + 1);
        return;
      }
      pbVar1 = pbVar3 + uVar4;
      uVar4 = uVar4 + 1;
    } while (-1 < (char)""[*pbVar1]);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DequoteToken(Token *p){
  unsigned int i;
  if( p->n<2 ) return;
  if( !sqlite3Isquote(p->z[0]) ) return;
  for(i=1; i<p->n-1; i++){
    if( sqlite3Isquote(p->z[i]) ) return;
  }
  p->n -= 2;
  p->z++;
}